

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

void __thiscall
ON_PostEffect::CImpl::SetPropertyValue(CImpl *this,wchar_t *name,ON_XMLVariant *value)

{
  ON_XMLNode *pOVar1;
  ON_wString local_90;
  ON_XMLProperty local_88;
  
  pOVar1 = PepNode(this);
  if (pOVar1 != (ON_XMLNode *)0x0) {
    ON_wString::ON_wString(&local_90,name);
    ON_XMLProperty::ON_XMLProperty(&local_88,&local_90,value);
    (*pOVar1->_vptr_ON_XMLNode[0xd])(pOVar1,&local_88);
    ON_XMLProperty::~ON_XMLProperty(&local_88);
    ON_wString::~ON_wString(&local_90);
  }
  return;
}

Assistant:

void ON_PostEffect::CImpl::SetPropertyValue(const wchar_t* name, const ON_XMLVariant& value) const
{
  auto* pep_node = PepNode();
  if (nullptr != pep_node)
  {
    pep_node->SetProperty(ON_XMLProperty(name, value));
  }
}